

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall InterpTest_Disassemble_Test::TestBody(InterpTest_Disassemble_Test *this)

{
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> buf;
  MemoryStream stream;
  unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_48;
  MemoryStream local_40;
  
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (anonymous_namespace)::s_fac_module);
  wabt::MemoryStream::MemoryStream(&local_40,(Stream *)0x0);
  wabt::interp::Istream::Disassemble
            (&(this->super_InterpTest).module_desc_.istream,&local_40.super_Stream);
  wabt::MemoryStream::ReleaseOutputBuffer(&local_40);
  InterpTest::ExpectBufferStrEq
            (&this->super_InterpTest,
             (OutputBuffer *)
             local_48._M_t.
             super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
             super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl,
             "   0| alloca 1\n   8| i32.const 1\n  16| local.set $2, %[-1]\n  24| local.get $1\n  32| local.get $3\n  40| i32.eqz %[-1]\n  44| br_unless @60, %[-1]\n  52| br @116\n  60| local.get $3\n  68| i32.mul %[-2], %[-1]\n  72| local.set $2, %[-1]\n  80| local.get $2\n  88| i32.const 1\n  96| i32.sub %[-2], %[-1]\n 100| local.set $3, %[-1]\n 108| br @24\n 116| drop_keep $2 $1\n 128| return\n"
            );
  std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::~unique_ptr
            (&local_48);
  wabt::MemoryStream::~MemoryStream(&local_40);
  return;
}

Assistant:

TEST_F(InterpTest, Disassemble) {
  ReadModule(s_fac_module);

  MemoryStream stream;
  module_desc_.istream.Disassemble(&stream);
  auto buf = stream.ReleaseOutputBuffer();

  ExpectBufferStrEq(*buf,
R"(   0| alloca 1
   8| i32.const 1
  16| local.set $2, %[-1]
  24| local.get $1
  32| local.get $3
  40| i32.eqz %[-1]
  44| br_unless @60, %[-1]
  52| br @116
  60| local.get $3
  68| i32.mul %[-2], %[-1]
  72| local.set $2, %[-1]
  80| local.get $2
  88| i32.const 1
  96| i32.sub %[-2], %[-1]
 100| local.set $3, %[-1]
 108| br @24
 116| drop_keep $2 $1
 128| return
)");
}